

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

int __thiscall Renderer::init(Renderer *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  ostream *poVar2;
  Renderer *pRVar3;
  string local_98;
  undefined1 local_78 [32];
  string local_58;
  undefined1 local_38 [39];
  allocator<char> local_11;
  
  iVar1 = gladLoadGLLoader(glfwGetProcAddress);
  if (iVar1 != 0) {
    (*glad_glViewport)(0,0,(GLsizei)Config::width,(GLsizei)Config::height);
    (*glad_glEnable)(0xb71);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"shaders/screen.vert",(allocator<char> *)(local_38 + 0x26));
    pRVar3 = (Renderer *)local_78;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pRVar3,"shaders/screen.frag",&local_11);
    initFrameBuffer(pRVar3,&this->_screenbuffer,&local_98,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_78 + 0x20),"shaders/screen.vert",
               (allocator<char> *)(local_38 + 0x26));
    pRVar3 = (Renderer *)local_38;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pRVar3,"shaders/raymarch.frag",&local_11);
    initFrameBuffer(pRVar3,&this->_raymarchingbuffer,(string *)(local_78 + 0x20),(string *)local_38)
    ;
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string((string *)(local_78 + 0x20));
    return extraout_EAX;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[41m\x1b[1m[ERROR]\x1b[49m\x1b[0m ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFILE\x1b[0m    : ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/tmarrec[P]fluid-simulation/src/Renderer.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1mFUNCTION\x1b[0m: ");
  poVar2 = std::operator<<(poVar2,"init");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1mLINE\x1b[0m    : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cerr,"\x1b[1mMESSAGE\x1b[0m : ");
  poVar2 = std::operator<<(poVar2,"Failed to initialize glad");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(2);
}

Assistant:

void Renderer::init()
{
    if (!gladLoadGLLoader(reinterpret_cast<GLADloadproc>(glfwGetProcAddress)))
    {
        ERROR("Failed to initialize glad");
    }

    glViewport(0, 0, Config::width, Config::height);
    glEnable(GL_DEPTH_TEST);

    initFrameBuffer(_screenbuffer,
            "shaders/screen.vert", "shaders/screen.frag");
    initFrameBuffer(_raymarchingbuffer,
            "shaders/screen.vert", "shaders/raymarch.frag");
}